

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void decode_rrrr_extract_insert(DisasContext_conflict14 *ctx)

{
  uint uVar1;
  TCGContext_conflict9 *s;
  TCGContext_conflict9 *pTVar2;
  TCGContext_conflict9 *pTVar3;
  uint uVar4;
  uint uVar5;
  TCGTemp *a1;
  TCGv_i32 ret;
  TCGTemp *a3;
  TCGv_i32 pTVar6;
  TCGv_i32 pTVar7;
  uintptr_t o;
  TCGOpcode opc;
  uintptr_t o_4;
  uint uVar8;
  uintptr_t o_5;
  TCGv_i32 ret_00;
  uint uVar9;
  uintptr_t o_2;
  ulong uVar10;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar4 = uVar1 >> 8 & 0xf;
  uVar10 = (ulong)(uVar1 >> 0x18 & 0xf);
  uVar5 = uVar1 >> 0x1c;
  uVar9 = uVar1 >> 0x15 & 7;
  a1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)s);
  a3 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)a3 - (long)s);
  if (uVar9 - 2 < 2) {
    if ((uVar1 >> 0x18 & 1) != 0) {
      pTVar2 = ctx->uc->tcg_ctx;
      pTVar6 = tcg_const_i32_tricore(pTVar2,2);
      pTVar7 = tcg_const_i32_tricore(pTVar2,3);
      pTVar3 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                          (long)(int)(ctx->base).pc_next);
      local_48 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
      local_40 = (TCGTemp *)(pTVar6 + (long)pTVar2);
      local_38 = (TCGTemp *)(pTVar7 + (long)pTVar2);
      tcg_gen_callN_tricore(pTVar2,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_48);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar6 + (long)pTVar2));
      tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar7 + (long)pTVar2));
    }
    tcg_gen_andi_i32_tricore(s,ret_00,s->cpu_gpr_d[uVar10 + 1],0x1f);
    tcg_gen_andi_i32_tricore(s,ret,s->cpu_gpr_d[uVar10],0x1f);
    tcg_gen_op3_tricore(s,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
    tcg_gen_subfi_i32_tricore(s,ret,0x20,ret);
    tcg_gen_op3_tricore(s,INDEX_op_shl_i32,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr_d[uVar5]),
                        (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr_d[uVar4]),(TCGArg)a1);
    tcg_gen_subfi_i32_tricore(s,ret_00,0x20,ret_00);
    pTVar6 = (TCGv_i32)((long)&s->pool_cur + (long)s->cpu_gpr_d[uVar5]);
    if (uVar9 == 2) {
      opc = INDEX_op_sar_i32;
    }
    else {
      opc = INDEX_op_shr_i32;
    }
    tcg_gen_op3_tricore(s,opc,(TCGArg)pTVar6,(TCGArg)pTVar6,(TCGArg)a3);
  }
  else {
    uVar8 = uVar1 >> 0xc & 0xf;
    if (uVar9 == 0) {
      if ((uVar1 >> 0x18 & 1) != 0) {
        pTVar2 = ctx->uc->tcg_ctx;
        pTVar6 = tcg_const_i32_tricore(pTVar2,2);
        pTVar7 = tcg_const_i32_tricore(pTVar2,3);
        pTVar3 = ctx->uc->tcg_ctx;
        tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                            (long)(int)(ctx->base).pc_next);
        local_48 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
        local_40 = (TCGTemp *)(pTVar6 + (long)pTVar2);
        local_38 = (TCGTemp *)(pTVar7 + (long)pTVar2);
        tcg_gen_callN_tricore(pTVar2,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_48);
        (ctx->base).is_jmp = DISAS_NORETURN;
        tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar6 + (long)pTVar2));
        tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar7 + (long)pTVar2));
      }
      tcg_gen_andi_i32_tricore(s,ret_00,s->cpu_gpr_d[uVar10 + 1],0x1f);
      tcg_gen_andi_i32_tricore(s,ret,s->cpu_gpr_d[uVar10],0x1f);
      gen_insert(ctx,s->cpu_gpr_d[uVar5],s->cpu_gpr_d[uVar4],s->cpu_gpr_d[uVar8],ret_00,ret);
    }
    else if (uVar9 == 4) {
      tcg_gen_andi_i32_tricore(s,ret,s->cpu_gpr_d[uVar10],0x1f);
      if (uVar4 == uVar8) {
        tcg_gen_rotl_i32_tricore(s,s->cpu_gpr_d[uVar5],s->cpu_gpr_d[uVar4],ret);
      }
      else {
        tcg_gen_op3_tricore(s,INDEX_op_shl_i32,(TCGArg)a3,
                            (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr_d[uVar4]),(TCGArg)a1);
        tcg_gen_subfi_i32_tricore(s,ret,0x20,ret);
        tcg_gen_op3_tricore(s,INDEX_op_shr_i32,(TCGArg)a1,
                            (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr_d[uVar8]),(TCGArg)a1);
        tcg_gen_op3_tricore(s,INDEX_op_or_i32,
                            (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr_d[uVar5]),(TCGArg)a3,
                            (TCGArg)a1);
      }
    }
    else {
      pTVar2 = ctx->uc->tcg_ctx;
      pTVar6 = tcg_const_i32_tricore(pTVar2,2);
      pTVar7 = tcg_const_i32_tricore(pTVar2,1);
      pTVar3 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                          (long)(int)(ctx->base).pc_next);
      local_48 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
      local_40 = (TCGTemp *)(pTVar6 + (long)pTVar2);
      local_38 = (TCGTemp *)(pTVar7 + (long)pTVar2);
      tcg_gen_callN_tricore(pTVar2,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_48);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar6 + (long)pTVar2));
      tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar7 + (long)pTVar2));
    }
  }
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ret_00 + (long)s));
  return;
}

Assistant:

static void decode_rrrr_extract_insert(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;
    int r1, r2, r3, r4;
    TCGv tmp_width, tmp_pos;

    r1 = MASK_OP_RRRR_S1(ctx->opcode);
    r2 = MASK_OP_RRRR_S2(ctx->opcode);
    r3 = MASK_OP_RRRR_S3(ctx->opcode);
    r4 = MASK_OP_RRRR_D(ctx->opcode);
    op2 = MASK_OP_RRRR_OP2(ctx->opcode);

    tmp_pos = tcg_temp_new(tcg_ctx);
    tmp_width = tcg_temp_new(tcg_ctx);

    switch (op2) {
    case OPC2_32_RRRR_DEXTR:
        tcg_gen_andi_tl(tcg_ctx, tmp_pos, tcg_ctx->cpu_gpr_d[r3], 0x1f);
        if (r1 == r2) {
            tcg_gen_rotl_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r1], tmp_pos);
        } else {
            tcg_gen_shl_tl(tcg_ctx, tmp_width, tcg_ctx->cpu_gpr_d[r1], tmp_pos);
            tcg_gen_subfi_tl(tcg_ctx, tmp_pos, 32, tmp_pos);
            tcg_gen_shr_tl(tcg_ctx, tmp_pos, tcg_ctx->cpu_gpr_d[r2], tmp_pos);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tmp_width, tmp_pos);
        }
        break;
    case OPC2_32_RRRR_EXTR:
    case OPC2_32_RRRR_EXTR_U:
        CHECK_REG_PAIR(r3);
        tcg_gen_andi_tl(tcg_ctx, tmp_width, tcg_ctx->cpu_gpr_d[r3+1], 0x1f);
        tcg_gen_andi_tl(tcg_ctx, tmp_pos, tcg_ctx->cpu_gpr_d[r3], 0x1f);
        tcg_gen_add_tl(tcg_ctx, tmp_pos, tmp_pos, tmp_width);
        tcg_gen_subfi_tl(tcg_ctx, tmp_pos, 32, tmp_pos);
        tcg_gen_shl_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r1], tmp_pos);
        tcg_gen_subfi_tl(tcg_ctx, tmp_width, 32, tmp_width);
        if (op2 == OPC2_32_RRRR_EXTR) {
            tcg_gen_sar_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r4], tmp_width);
        } else {
            tcg_gen_shr_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r4], tmp_width);
        }
        break;
    case OPC2_32_RRRR_INSERT:
        CHECK_REG_PAIR(r3);
        tcg_gen_andi_tl(tcg_ctx, tmp_width, tcg_ctx->cpu_gpr_d[r3+1], 0x1f);
        tcg_gen_andi_tl(tcg_ctx, tmp_pos, tcg_ctx->cpu_gpr_d[r3], 0x1f);
        gen_insert(ctx, tcg_ctx->cpu_gpr_d[r4], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], tmp_width,
                   tmp_pos);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
    tcg_temp_free(tcg_ctx, tmp_pos);
    tcg_temp_free(tcg_ctx, tmp_width);
}